

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::AuxNode>::truncate
          (ArrayBuilder<capnp::compiler::NodeTranslator::AuxNode> *this,char *__file,
          __off_t __length)

{
  AuxNode *pAVar1;
  AuxNode *pAVar2;
  int in_EAX;
  int extraout_EAX;
  int extraout_EAX_00;
  
  pAVar1 = this->ptr;
  pAVar2 = this->pos;
  while (pAVar1 + (long)__file < pAVar2) {
    this->pos = pAVar2 + -1;
    if (pAVar2[-1].sourceInfo.builder.segment != (SegmentBuilder *)0x0) {
      capnp::_::OrphanBuilder::euthanize(&pAVar2[-1].sourceInfo.builder);
      in_EAX = extraout_EAX;
    }
    if (pAVar2[-1].node.builder.segment != (SegmentBuilder *)0x0) {
      capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)(pAVar2 + -1));
      in_EAX = extraout_EAX_00;
    }
    pAVar2 = this->pos;
  }
  return in_EAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }